

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

size_t * __thiscall
andres::
BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
::shapeBegin(BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
             *this)

{
  View<int,_true,_std::allocator<unsigned_long>_> *this_00;
  runtime_error *this_01;
  View<int,_true,_std::allocator<unsigned_long>_> *this_02;
  
  this_02 = this->e1_;
  if (this_02->data_ == (pointer)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Assertion failed.");
  }
  else {
    this_00 = this->e2_;
    if (this_00->data_ == (pointer)0x0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Assertion failed.");
    }
    else if ((this_02->geometry_).dimension_ < (this_00->geometry_).dimension_) {
      View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(this_00);
      this_02 = this_00;
      if (this_00->data_ != (pointer)0x0) {
LAB_00202932:
        return (this_02->geometry_).shape_;
      }
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Assertion failed.");
    }
    else {
      View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(this_02);
      if (this_02->data_ != (pointer)0x0) goto LAB_00202932;
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Assertion failed.");
    }
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const std::size_t* shapeBegin() const 
        { return e1_.dimension() < e2_.dimension() ? e2_.shapeBegin() : e1_.shapeBegin(); }